

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::readTrailer(QPDF *this)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  pointer pMVar5;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *in_RSI;
  QPDFObjectHandle QVar6;
  bool local_2fa;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  QPDFExc local_268;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  byte local_1b9;
  Token local_1b8;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  QPDFExc local_100;
  type_conflict2 *local_80;
  type_conflict2 *empty;
  type *object;
  allocator<char> local_59;
  string local_58;
  pair<QPDFObjectHandle,_bool> local_38;
  qpdf_offset_t local_20;
  qpdf_offset_t offset;
  QPDF *this_local;
  
  this_local = this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[4])();
  local_20 = CONCAT44(extraout_var,iVar2);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &pMVar3->file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"trailer",&local_59);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  QPDFParser::parse(&local_38,peVar4,&local_58,&pMVar3->tokenizer,(StringDecrypter *)0x0,
                    (QPDF *)in_RSI,(bool)(pMVar5->in_xref_reconstruction & 1));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  empty = (type_conflict2 *)std::get<0ul,QPDFObjectHandle,bool>(&local_38);
  local_80 = std::get<1ul,QPDFObjectHandle,bool>(&local_38);
  if ((*local_80 & 1U) == 0) {
    local_1b9 = 0;
    local_1e2 = 0;
    local_1e3 = 0;
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)empty);
    local_2fa = false;
    if (bVar1) {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (in_RSI);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar3->file);
      readToken(&local_1b8,(QPDF *)in_RSI,peVar4,0);
      local_1b9 = 1;
      std::allocator<char>::allocator();
      local_1e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"stream",&local_1e1);
      local_1e3 = 1;
      local_2fa = QPDFTokenizer::Token::isWord(&local_1b8,&local_1e0);
    }
    if ((local_1e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    if ((local_1e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1e1);
    }
    if ((local_1b9 & 1) != 0) {
      QPDFTokenizer::Token::~Token(&local_1b8);
    }
    if (local_2fa != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"trailer",&local_289);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (in_RSI);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar3->file);
      iVar2 = (*peVar4->_vptr_InputSource[4])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"stream keyword found in trailer",&local_2b1);
      damagedPDF(&local_268,(QPDF *)in_RSI,&local_288,CONCAT44(extraout_var_00,iVar2),&local_2b0);
      warn((QPDF *)in_RSI,&local_268);
      QPDFExc::~QPDFExc(&local_268);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"trailer",&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"empty object treated as null",&local_149);
    damagedPDF(&local_100,(QPDF *)in_RSI,&local_120,&local_148);
    warn((QPDF *)in_RSI,&local_100);
    QPDFExc::~QPDFExc(&local_100);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  InputSource::setLastOffset(peVar4,local_20);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)empty);
  std::pair<QPDFObjectHandle,_bool>::~pair(&local_38);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readTrailer()
{
    qpdf_offset_t offset = m->file->tell();
    auto [object, empty] = QPDFParser::parse(
        *m->file, "trailer", m->tokenizer, nullptr, *this, m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF("trailer", "empty object treated as null"));
    } else if (object.isDictionary() && readToken(*m->file).isWord("stream")) {
        warn(damagedPDF("trailer", m->file->tell(), "stream keyword found in trailer"));
    }
    // Override last_offset so that it points to the beginning of the object we just read
    m->file->setLastOffset(offset);
    return object;
}